

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_vectors.h
# Opt level: O0

uint16_t __thiscall Bitvec16x16::Extract(Bitvec16x16 *this,int index)

{
  code *pcVar1;
  undefined4 uVar2;
  int index_local;
  Bitvec16x16 *this_local;
  uint16_t local_2;
  
  switch(index) {
  case 0:
    local_2 = (uint16_t)(int)this->vec[0];
    break;
  case 1:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])this->vec,1);
    local_2 = (uint16_t)uVar2;
    break;
  case 2:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])this->vec,2);
    local_2 = (uint16_t)uVar2;
    break;
  case 3:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])this->vec,3);
    local_2 = (uint16_t)uVar2;
    break;
  case 4:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])this->vec,4);
    local_2 = (uint16_t)uVar2;
    break;
  case 5:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])this->vec,5);
    local_2 = (uint16_t)uVar2;
    break;
  case 6:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])this->vec,6);
    local_2 = (uint16_t)uVar2;
    break;
  case 7:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])this->vec,7);
    local_2 = (uint16_t)uVar2;
    break;
  case 8:
    local_2 = (uint16_t)(int)this->vec[2];
    break;
  case 9:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])(this->vec + 2),1);
    local_2 = (uint16_t)uVar2;
    break;
  case 10:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])(this->vec + 2),2);
    local_2 = (uint16_t)uVar2;
    break;
  case 0xb:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])(this->vec + 2),3);
    local_2 = (uint16_t)uVar2;
    break;
  case 0xc:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])(this->vec + 2),4);
    local_2 = (uint16_t)uVar2;
    break;
  case 0xd:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])(this->vec + 2),5);
    local_2 = (uint16_t)uVar2;
    break;
  case 0xe:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])(this->vec + 2),6);
    local_2 = (uint16_t)uVar2;
    break;
  case 0xf:
    uVar2 = vpextrw_avx(*(undefined1 (*) [16])(this->vec + 2),7);
    local_2 = (uint16_t)uVar2;
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return local_2;
}

Assistant:

inline uint16_t Extract(int index) const {
#define CASE(x) case x: return _mm256_extract_epi16(vec, x);
        switch (index) {
            CASE(0)
            CASE(1)
            CASE(2)
            CASE(3)
            CASE(4)
            CASE(5)
            CASE(6)
            CASE(7)
            CASE(8)
            CASE(9)
            CASE(10)
            CASE(11)
            CASE(12)
            CASE(13)
            CASE(14)
            CASE(15)
        }
#undef CASE
    }